

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int vorbis_decode_packet(vorb *f,int *len,int *p_left,int *p_right)

{
  Floor *pFVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  int32 n;
  Floor *pFVar9;
  int16 *piVar10;
  MappingChannel *pMVar11;
  float *pfVar12;
  short *psVar13;
  int iVar14;
  uint n_00;
  uint32 uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  short sVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  float *pfVar33;
  int iVar34;
  int iVar35;
  Mapping *pMVar36;
  Codebook *pCVar37;
  int *piVar38;
  int iVar39;
  long lVar40;
  bool bVar41;
  float fVar42;
  float fVar43;
  int n2;
  int right_end;
  int mode;
  int *local_9f0;
  int *local_9e8;
  long local_9e0;
  long local_9d8;
  Floor *local_9d0;
  Mode *local_9c8;
  int left_end;
  float *residue_buffers [16];
  uint8 local_938 [256];
  int really_zero_channel [256];
  int zero_channel [256];
  
  local_9f0 = len;
  iVar14 = vorbis_decode_initial(f,p_left,&left_end,p_right,&right_end,&mode);
  if (iVar14 == 0) {
    return 0;
  }
  local_9c8 = f->mode_config + mode;
  iVar14 = *p_left;
  iVar20 = *p_right;
  pMVar36 = f->mapping + f->mode_config[mode].mapping;
  iVar8 = f->blocksize[local_9c8->blockflag];
  n_00 = iVar8 >> 1;
  local_9e8 = p_left;
  for (lVar40 = 0; lVar40 < f->channels; lVar40 = lVar40 + 1) {
    bVar3 = pMVar36->chan[lVar40].mux;
    zero_channel[lVar40] = 0;
    uVar25 = (ulong)pMVar36->submap_floor[bVar3];
    if (f->floor_types[uVar25] == 0) {
      f->error = VORBIS_invalid_stream;
      return 0;
    }
    pFVar9 = f->floor_config;
    uVar15 = get_bits(f,1);
    if (uVar15 == 0) {
LAB_0013a8ac:
      zero_channel[lVar40] = 1;
    }
    else {
      local_9d8 = uVar25 * 0x63c;
      pFVar1 = pFVar9 + uVar25;
      n = *(int32 *)("" + (ulong)(pFVar1->floor1).floor1_multiplier * 4 + 0xc);
      piVar10 = f->finalY[lVar40];
      local_9e0 = lVar40;
      local_9d0 = pFVar9;
      iVar16 = ilog(n);
      uVar15 = get_bits(f,iVar16 + -1);
      *piVar10 = (int16)uVar15;
      uVar15 = get_bits(f,iVar16 + -1);
      piVar10[1] = (int16)uVar15;
      iVar16 = 2;
      for (uVar25 = 0; uVar25 < (pFVar1->floor0).order; uVar25 = uVar25 + 1) {
        bVar3 = *(byte *)((long)pFVar1 + uVar25 + 1);
        uVar24 = (ulong)bVar3;
        bVar4 = *(byte *)((long)pFVar1 + uVar24 + 0x21);
        bVar5 = *(byte *)((long)pFVar1 + uVar24 + 0x31);
        if (bVar5 == 0) {
          uVar31 = 0;
        }
        else {
          pCVar37 = f->codebooks + *(byte *)((long)pFVar1 + uVar24 + 0x41);
          if (f->valid_bits < 10) {
            prep_huffman(f);
          }
          uVar31 = (uint)pCVar37->fast_huffman[f->acc & 0x3ff];
          if (pCVar37->fast_huffman[f->acc & 0x3ff] < 0) {
            uVar31 = codebook_decode_scalar_raw(f,pCVar37);
          }
          else {
            bVar6 = pCVar37->codeword_lengths[(int)uVar31];
            f->acc = f->acc >> (bVar6 & 0x1f);
            iVar17 = f->valid_bits - (uint)bVar6;
            bVar41 = iVar17 < 0;
            if (iVar17 < 1) {
              iVar17 = 0;
            }
            if (bVar41) {
              uVar31 = 0xffffffff;
            }
            f->valid_bits = iVar17;
          }
          if (pCVar37->sparse != '\0') {
            uVar31 = pCVar37->sorted_values[(int)uVar31];
          }
        }
        iVar17 = (uint)bVar4 + iVar16;
        for (lVar40 = (long)iVar16; iVar17 != lVar40; lVar40 = lVar40 + 1) {
          lVar21 = (long)*(short *)((long)pFVar1 +
                                   (ulong)(uVar31 & ~(-1 << (bVar5 & 0x1f))) * 2 +
                                   (ulong)bVar3 * 0x10 + 0x52);
          uVar31 = (int)uVar31 >> (bVar5 & 0x1f);
          if (lVar21 < 0) {
            iVar16 = 0;
          }
          else {
            pCVar37 = f->codebooks + lVar21;
            if (f->valid_bits < 10) {
              prep_huffman(f);
            }
            iVar16 = (int)pCVar37->fast_huffman[f->acc & 0x3ff];
            if (pCVar37->fast_huffman[f->acc & 0x3ff] < 0) {
              iVar16 = codebook_decode_scalar_raw(f,pCVar37);
            }
            else {
              bVar4 = pCVar37->codeword_lengths[iVar16];
              f->acc = f->acc >> (bVar4 & 0x1f);
              iVar27 = f->valid_bits - (uint)bVar4;
              iVar29 = iVar27;
              if (iVar27 < 1) {
                iVar29 = 0;
              }
              if (iVar27 < 0) {
                iVar16 = -1;
              }
              f->valid_bits = iVar29;
            }
            if (pCVar37->sparse != '\0') {
              iVar16 = pCVar37->sorted_values[iVar16];
            }
          }
          piVar10[lVar40] = (int16)iVar16;
        }
        iVar16 = iVar17;
      }
      lVar40 = local_9e0;
      if (f->valid_bits == -1) goto LAB_0013a8ac;
      really_zero_channel[0]._0_2_ = 0x101;
      uVar31 = (pFVar1->floor1).values;
      for (lVar21 = 0; lVar21 + 2 < (long)(int)uVar31; lVar21 = lVar21 + 1) {
        bVar3 = *(byte *)((long)local_9d0 + lVar21 * 2 + local_9d8 + 0x444);
        bVar4 = *(byte *)((long)local_9d0 + lVar21 * 2 + local_9d8 + 0x445);
        iVar16 = (int)*(short *)((long)piVar10 + (ulong)((uint)bVar3 + (uint)bVar3));
        iVar17 = (int)*(short *)((long)piVar10 + (ulong)((uint)bVar4 + (uint)bVar4));
        uVar32 = (uint)*(ushort *)((long)pFVar1 + (ulong)((uint)bVar3 + (uint)bVar3) + 0x152);
        uVar28 = iVar17 - iVar16;
        uVar18 = -uVar28;
        if (0 < (int)uVar28) {
          uVar18 = uVar28;
        }
        iVar27 = (int)((*(ushort *)((long)local_9d0 + lVar21 * 2 + local_9d8 + 0x156) - uVar32) *
                      (uVar18 & 0xffff)) /
                 (int)(*(ushort *)((long)pFVar1 + (ulong)((uint)bVar4 + (uint)bVar4) + 0x152) -
                      uVar32);
        iVar29 = -iVar27;
        if (-1 < iVar17 - iVar16) {
          iVar29 = iVar27;
        }
        iVar29 = iVar29 + iVar16;
        sVar26 = piVar10[lVar21 + 2];
        uVar18 = (uint)sVar26;
        if (sVar26 == 0) {
          *(undefined1 *)((long)really_zero_channel + lVar21 + 2) = 0;
LAB_0013a853:
          sVar26 = (short)iVar29;
LAB_0013a858:
          piVar10[lVar21 + 2] = sVar26;
        }
        else {
          iVar17 = n - iVar29;
          iVar16 = iVar29;
          if (iVar17 < iVar29) {
            iVar16 = iVar17;
          }
          *(undefined1 *)((long)really_zero_channel + (ulong)bVar4) = 1;
          *(undefined1 *)((long)really_zero_channel + (ulong)bVar3) = 1;
          *(undefined1 *)((long)really_zero_channel + lVar21 + 2) = 1;
          if ((int)uVar18 < iVar16 * 2) {
            if ((uVar18 & 1) == 0) {
              iVar29 = iVar29 + (uVar18 >> 1);
            }
            else {
              iVar29 = iVar29 - (uVar18 + 1 >> 1);
            }
            goto LAB_0013a853;
          }
          if (iVar17 <= iVar29) {
            sVar26 = ((short)iVar29 - sVar26) + (short)iVar17 + -1;
            goto LAB_0013a858;
          }
        }
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      for (uVar25 = 0; uVar31 != uVar25; uVar25 = uVar25 + 1) {
        if (*(char *)((long)really_zero_channel + uVar25) == '\0') {
          piVar10[uVar25] = -1;
        }
      }
    }
  }
  if (((f->alloc).alloc_buffer != (char *)0x0) &&
     ((f->alloc).alloc_buffer_length_in_bytes != f->temp_offset)) {
    __assert_fail("f->alloc.alloc_buffer_length_in_bytes == f->temp_offset",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                  ,0xccd,
                  "int vorbis_decode_packet_rest(vorb *, int *, Mode *, int, int, int, int, int *)")
    ;
  }
  memcpy(really_zero_channel,zero_channel,(long)f->channels << 2);
  uVar7 = pMVar36->coupling_steps;
  for (lVar40 = 0; (ulong)uVar7 * 3 != lVar40; lVar40 = lVar40 + 3) {
    pMVar11 = pMVar36->chan;
    bVar3 = (&pMVar11->magnitude)[lVar40];
    if (zero_channel[bVar3] == 0) {
      uVar25 = (ulong)(&pMVar11->angle)[lVar40];
LAB_0013a930:
      zero_channel[uVar25] = 0;
      zero_channel[bVar3] = 0;
    }
    else {
      uVar25 = (ulong)(&pMVar11->angle)[lVar40];
      if (zero_channel[uVar25] == 0) goto LAB_0013a930;
    }
  }
  for (uVar25 = 0; uVar25 < pMVar36->submaps; uVar25 = uVar25 + 1) {
    uVar22 = 0;
    uVar24 = (ulong)(uint)f->channels;
    if (f->channels < 1) {
      uVar24 = uVar22;
    }
    lVar40 = 0x1bc;
    iVar16 = 0;
    for (; uVar24 * 3 != uVar22; uVar22 = uVar22 + 3) {
      if (uVar25 == (&pMVar36->chan->mux)[uVar22]) {
        bVar41 = *(int *)((long)really_zero_channel + lVar40 + 0x244) == 0;
        if (bVar41) {
          pfVar33 = *(float **)((long)&f->sample_rate + lVar40 * 2);
        }
        else {
          pfVar33 = (float *)0x0;
        }
        local_938[iVar16] = !bVar41;
        residue_buffers[iVar16] = pfVar33;
        iVar16 = iVar16 + 1;
      }
      lVar40 = lVar40 + 4;
    }
    decode_residue(f,residue_buffers,iVar16,n_00,(uint)pMVar36->submap_residue[uVar25],local_938);
  }
  if (((f->alloc).alloc_buffer != (char *)0x0) &&
     ((f->alloc).alloc_buffer_length_in_bytes != f->temp_offset)) {
    __assert_fail("f->alloc.alloc_buffer_length_in_bytes == f->temp_offset",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                  ,0xcee,
                  "int vorbis_decode_packet_rest(vorb *, int *, Mode *, int, int, int, int, int *)")
    ;
  }
  uVar25 = (ulong)pMVar36->coupling_steps;
  uVar24 = 0;
  if (0 < (int)n_00) {
    uVar24 = (ulong)n_00;
  }
  while (0 < (long)uVar25) {
    uVar25 = uVar25 - 1;
    pfVar33 = f->channel_buffers[pMVar36->chan[uVar25].magnitude];
    pfVar12 = f->channel_buffers[pMVar36->chan[uVar25].angle];
    for (uVar22 = 0; uVar24 != uVar22; uVar22 = uVar22 + 1) {
      fVar43 = pfVar33[uVar22];
      fVar2 = pfVar12[uVar22];
      fVar42 = fVar43;
      if (fVar43 <= 0.0) {
        if (fVar2 <= 0.0) {
          fVar42 = fVar43 - fVar2;
        }
        else {
          fVar43 = fVar2 + fVar43;
        }
      }
      else if (fVar2 <= 0.0) {
        fVar42 = fVar2 + fVar43;
      }
      else {
        fVar43 = fVar43 - fVar2;
      }
      pfVar33[uVar22] = fVar42;
      pfVar12[uVar22] = fVar43;
    }
  }
  piVar38 = local_9e8;
  for (lVar40 = 0; uVar25 = (ulong)f->channels, lVar40 < (long)uVar25; lVar40 = lVar40 + 1) {
    pfVar33 = f->channel_buffers[lVar40];
    if (really_zero_channel[lVar40] == 0) {
      if (f->floor_types[pMVar36->submap_floor[pMVar36->chan[lVar40].mux]] == 0) {
        f->error = VORBIS_invalid_stream;
      }
      else {
        psVar13 = f->finalY[lVar40];
        pFVar9 = f->floor_config;
        lVar23 = (ulong)pMVar36->submap_floor[pMVar36->chan[lVar40].mux] * 0x63c;
        bVar3 = *(byte *)((long)pFVar9 + lVar23 + 0x634);
        uVar18 = (int)*psVar13 * (uint)bVar3;
        iVar16 = *(int *)((long)pFVar9 + lVar23 + 0x638);
        uVar31 = 0;
        lVar21 = 1;
        while( true ) {
          uVar25 = (ulong)uVar31;
          if (iVar16 <= lVar21) break;
          uVar24 = (ulong)*(byte *)((long)pFVar9 + lVar21 + lVar23 + 0x346);
          sVar26 = psVar13[uVar24];
          uVar28 = uVar18;
          if (-1 < sVar26) {
            uVar28 = (int)sVar26 * (uint)bVar3;
            uVar7 = *(ushort *)((long)pFVar9 + uVar24 * 2 + lVar23 + 0x152);
            uVar32 = (uint)uVar7;
            iVar17 = uVar32 - uVar31;
            if (iVar17 != 0) {
              iVar27 = uVar28 - uVar18;
              iVar29 = -iVar27;
              if (0 < iVar27) {
                iVar29 = iVar27;
              }
              iVar19 = iVar27 / iVar17;
              iVar34 = -iVar19;
              if (0 < iVar19) {
                iVar34 = iVar19;
              }
              uVar30 = n_00;
              if ((int)(uint)uVar7 < (int)n_00) {
                uVar30 = uVar32;
              }
              bVar41 = (int)uVar31 < (int)uVar30;
              uVar31 = uVar32;
              if (bVar41) {
                pfVar33[uVar25] = inverse_db_table[uVar18 & 0xff] * pfVar33[uVar25];
                iVar35 = 0;
                while (uVar25 = uVar25 + 1, (long)uVar25 < (long)(int)uVar30) {
                  iVar35 = iVar35 + (iVar29 - iVar34 * iVar17);
                  uVar32 = 0;
                  iVar39 = 0;
                  if (iVar17 <= iVar35) {
                    uVar32 = iVar27 >> 0x1f | 1;
                    iVar39 = iVar17;
                  }
                  iVar35 = iVar35 - iVar39;
                  uVar18 = uVar18 + iVar19 + uVar32;
                  pfVar33[uVar25] = inverse_db_table[uVar18 & 0xff] * pfVar33[uVar25];
                }
              }
            }
          }
          uVar18 = uVar28;
          lVar21 = lVar21 + 1;
        }
        piVar38 = local_9e8;
        if ((int)uVar31 < (int)n_00) {
          for (; (long)(int)n_00 != uVar25; uVar25 = uVar25 + 1) {
            pfVar33[uVar25] = inverse_db_table[(int)uVar18] * pfVar33[uVar25];
          }
        }
      }
    }
    else {
      memset(pfVar33,0,(long)(int)n_00 * 4);
    }
  }
  for (lVar40 = 0; lVar40 < (int)uVar25; lVar40 = lVar40 + 1) {
    inverse_mdct(f->channel_buffers[lVar40],iVar8,f,(uint)local_9c8->blockflag);
    uVar25 = (ulong)(uint)f->channels;
  }
  flush_packet(f);
  if (f->first_decode == '\0') {
    iVar8 = f->discard_samples_deferred;
    if (iVar8 != 0) {
      if (iVar8 < iVar20 - iVar14) {
        *piVar38 = iVar14 + iVar8;
        f->discard_samples_deferred = 0;
        iVar14 = iVar14 + iVar8;
      }
      else {
        f->discard_samples_deferred = iVar8 - (iVar20 - iVar14);
        *piVar38 = iVar20;
        iVar14 = iVar20;
      }
    }
  }
  else {
    f->current_loc = -n_00;
    f->discard_samples_deferred = iVar8 - right_end;
    f->current_loc_valid = 1;
    f->first_decode = '\0';
  }
  if (f->last_seg_which == f->end_seg_with_known_loc) {
    if ((f->current_loc_valid != 0) && ((f->page_flag & 4) != 0)) {
      uVar31 = f->current_loc;
      uVar18 = f->known_loc_for_packet;
      if (uVar18 < (right_end - iVar14) + uVar31) {
        iVar20 = uVar18 - uVar31;
        if (uVar18 < uVar31) {
          iVar20 = 0;
        }
        iVar8 = iVar20 + iVar14;
        if (right_end <= iVar20 + iVar14) {
          iVar8 = right_end;
        }
        *local_9f0 = iVar8;
        f->current_loc = f->current_loc + iVar8;
        return 1;
      }
    }
    uVar15 = (iVar14 - n_00) + f->known_loc_for_packet;
    f->current_loc_valid = 1;
  }
  else {
    if (f->current_loc_valid == 0) goto LAB_0013ae1b;
    uVar15 = f->current_loc;
  }
  f->current_loc = (iVar20 - iVar14) + uVar15;
LAB_0013ae1b:
  if (((f->alloc).alloc_buffer != (char *)0x0) &&
     ((f->alloc).alloc_buffer_length_in_bytes != f->temp_offset)) {
    __assert_fail("f->alloc.alloc_buffer_length_in_bytes == f->temp_offset",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                  ,0xd62,
                  "int vorbis_decode_packet_rest(vorb *, int *, Mode *, int, int, int, int, int *)")
    ;
  }
  *local_9f0 = right_end;
  return 1;
}

Assistant:

static int vorbis_decode_packet(vorb *f, int *len, int *p_left, int *p_right)
{
   int mode, left_end, right_end;
   if (!vorbis_decode_initial(f, p_left, &left_end, p_right, &right_end, &mode)) return 0;
   return vorbis_decode_packet_rest(f, len, f->mode_config + mode, *p_left, left_end, *p_right, right_end, p_left);
}